

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

TriggerStep * triggerStepAllocate(sqlite3 *db,u8 op,Token *pName)

{
  TriggerStep *pTVar1;
  TriggerStep *z;
  
  pTVar1 = (TriggerStep *)sqlite3DbMallocZero(db,(ulong)pName->n + 0x49);
  if (pTVar1 != (TriggerStep *)0x0) {
    z = pTVar1 + 1;
    memcpy(z,pName->z,(ulong)pName->n);
    sqlite3Dequote((char *)z);
    pTVar1->zTarget = (char *)z;
    pTVar1->op = op;
  }
  return pTVar1;
}

Assistant:

static TriggerStep *triggerStepAllocate(
  sqlite3 *db,                /* Database connection */
  u8 op,                      /* Trigger opcode */
  Token *pName                /* The target name */
){
  TriggerStep *pTriggerStep;

  pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep) + pName->n + 1);
  if( pTriggerStep ){
    char *z = (char*)&pTriggerStep[1];
    memcpy(z, pName->z, pName->n);
    sqlite3Dequote(z);
    pTriggerStep->zTarget = z;
    pTriggerStep->op = op;
  }
  return pTriggerStep;
}